

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::AddSensorType(Minefield_Query_PDU *this,SensorType ST)

{
  value_type_conflict2 local_16;
  SensorType local_14;
  Minefield_Query_PDU *pMStack_10;
  SensorType ST_local;
  Minefield_Query_PDU *this_local;
  
  local_16 = (value_type_conflict2)ST;
  local_14 = ST;
  pMStack_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vui16SensorTypes,&local_16);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength + 2;
  this->m_ui8NumSensTyp = this->m_ui8NumSensTyp + '\x01';
  calcPadding(this);
  return;
}

Assistant:

void Minefield_Query_PDU::AddSensorType( SensorType ST )
{
    m_vui16SensorTypes.push_back( ST );
    m_ui16PDULength += 2; // 16 bit enum. = 2 octets
    ++m_ui8NumSensTyp;
    calcPadding();
}